

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value),_uintwide_t<256U,_unsigned_short,_void,_true>_>
* __thiscall
math::wide_integer::uintwide_t<256u,unsigned_short,void,true>::operator>>=
          (uintwide_t<256u,unsigned_short,void,true> *this,int n)

{
  bool bVar1;
  limb_type_conflict val;
  uint n_00;
  iterator first;
  iterator last;
  int n_local;
  uintwide_t<256U,_unsigned_short,_void,_true> *this_local;
  
  if (n < 0) {
    n_00 = detail::negate<int>(n);
    operator<<=(this,n_00);
  }
  else if (0 < n) {
    bVar1 = uintwide_t<256U,_unsigned_short,_void,_true>::exceeds_width<int>(n);
    if (bVar1) {
      first = detail::array_detail::array<unsigned_short,_16UL>::begin
                        ((array<unsigned_short,_16UL> *)this);
      last = detail::array_detail::array<unsigned_short,_16UL>::end
                       ((array<unsigned_short,_16UL> *)this);
      val = uintwide_t<256U,_unsigned_short,_void,_true>::right_shift_fill_value
                      ((uintwide_t<256U,_unsigned_short,_void,_true> *)this);
      detail::fill_unsafe<unsigned_short*,unsigned_short>(first,last,val);
    }
    else {
      uintwide_t<256U,_unsigned_short,_void,_true>::shr<int>
                ((uintwide_t<256U,_unsigned_short,_void,_true> *)this,n);
    }
  }
  return (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value),_uintwide_t<256U,_unsigned_short,_void,_true>_>
          *)this;
}

Assistant:

constexpr auto operator>>=(const SignedIntegralType n) -> std::enable_if_t<(   std::is_integral<SignedIntegralType>::value
                                                                                && std::is_signed  <SignedIntegralType>::value), uintwide_t>&
    {
      // Implement right-shift operator for signed integral argument.
      if(n < static_cast<SignedIntegralType>(0))
      {
        using local_unsigned_type =
          typename detail::uint_type_helper<static_cast<size_t>(std::numeric_limits<SignedIntegralType>::digits + 1)>::exact_unsigned_type;

        operator<<=(static_cast<local_unsigned_type>(detail::negate(n)));
      }
      else if(n > static_cast<SignedIntegralType>(0))
      {
        if(exceeds_width(n))
        {
          // Fill with either 0's or 1's. Note also the implementation-defined
          // behavior of excessive right-shift of negative value.

          // Exclude this line from code coverage, even though explicit
          // test cases (search for "result_overshift_is_ok") are known
          // to cover this line.
          detail::fill_unsafe(values.begin(), values.end(), right_shift_fill_value()); // LCOV_EXCL_LINE
        }
        else
        {
          shr(n);
        }
      }

      return *this;
    }